

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

ssize_t fio_read(intptr_t uuid,void *buffer,size_t count)

{
  int iVar1;
  code *pcVar2;
  undefined8 uVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  ssize_t ret;
  int old_errno;
  void *udata;
  _func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *rw_read;
  size_t count_local;
  void *buffer_local;
  intptr_t uuid_local;
  
  if ((((uuid < 0) || (uVar4 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar4)) ||
      ((uuid & 0xffU) != (ulong)*(byte *)((long)fio_data + (long)(int)uVar4 * 0xa8 + 0x6d))) ||
     (*(char *)((long)fio_data + (long)(int)uVar4 * 0xa8 + 0x6f) == '\0')) {
    piVar5 = __errno_location();
    *piVar5 = 9;
    uuid_local = -1;
  }
  else if (count == 0) {
    uuid_local = 0;
  }
  else {
    fio_lock((fio_lock_i *)((long)fio_data + (long)(int)uVar4 * 0xa8 + 0x6e));
    pcVar2 = (code *)**(undefined8 **)((long)fio_data + (long)(int)uVar4 * 0xa8 + 0xa8);
    uVar3 = *(undefined8 *)((long)fio_data + (long)(int)uVar4 * 0xa8 + 0xb0);
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar4 * 0xa8 + 0x6e));
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    do {
      lVar6 = (*pcVar2)(uuid,uVar3,buffer,count);
      if (0 < lVar6) {
        fio_touch(uuid);
        return lVar6;
      }
    } while ((lVar6 < 0) && (piVar5 = __errno_location(), *piVar5 == 4));
    if ((lVar6 < 0) &&
       (((piVar5 = __errno_location(), *piVar5 == 0xb ||
         (piVar5 = __errno_location(), *piVar5 == 0xb)) ||
        (piVar5 = __errno_location(), *piVar5 == 0x6b)))) {
      piVar5 = __errno_location();
      *piVar5 = iVar1;
      uuid_local = 0;
    }
    else {
      fio_force_close(uuid);
      uuid_local = -1;
    }
  }
  return uuid_local;
}

Assistant:

ssize_t fio_read(intptr_t uuid, void *buffer, size_t count) {
  if (!uuid_is_valid(uuid) || !uuid_data(uuid).open) {
    errno = EBADF;
    return -1;
  }
  if (count == 0)
    return 0;
  fio_lock(&uuid_data(uuid).sock_lock);
  ssize_t (*rw_read)(intptr_t, void *, void *, size_t) =
      uuid_data(uuid).rw_hooks->read;
  void *udata = uuid_data(uuid).rw_udata;
  fio_unlock(&uuid_data(uuid).sock_lock);
  int old_errno = errno;
  ssize_t ret;
retry_int:
  ret = rw_read(uuid, udata, buffer, count);
  if (ret > 0) {
    fio_touch(uuid);
    return ret;
  }
  if (ret < 0 && errno == EINTR)
    goto retry_int;
  if (ret < 0 &&
      (errno == EWOULDBLOCK || errno == EAGAIN || errno == ENOTCONN)) {
    errno = old_errno;
    return 0;
  }
  fio_force_close(uuid);
  return -1;
}